

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

Boxed_Value
chaiscript::dispatch::detail::
call_func<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value),chaiscript::Boxed_Value,chaiscript::Boxed_Value,chaiscript::Boxed_Value,0ul,1ul>
          (element_type *param_1,_func_Boxed_Value_Boxed_Value_Boxed_Value **param_2,
          Function_Params *param_3,Function_Params *param_4,Type_Conversions_State *param_5)

{
  Boxed_Value *pBVar1;
  Boxed_Value *pBVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  Boxed_Value local_58;
  Boxed_Value local_48;
  Type_Conversions_State *local_38;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_Boxed_Value_Boxed_Value_Boxed_Value **f_local;
  _func_Boxed_Value_Boxed_Value_Boxed_Value *param_0_local;
  element_type *local_10;
  
  pBVar1 = param_3->m_begin;
  local_38 = param_5;
  t_conversions_local = (Type_Conversions_State *)param_4;
  params_local = param_3;
  f_local = param_2;
  local_10 = param_1;
  pBVar2 = Function_Params::operator[](param_4,0);
  boxed_cast<chaiscript::Boxed_Value>((chaiscript *)&local_48,pBVar2,local_38);
  pBVar2 = Function_Params::operator[]((Function_Params *)t_conversions_local,1);
  boxed_cast<chaiscript::Boxed_Value>((chaiscript *)&local_58,pBVar2,local_38);
  (*(code *)pBVar1)(param_1,&local_48,&local_58);
  Boxed_Value::~Boxed_Value(&local_58);
  Boxed_Value::~Boxed_Value(&local_48);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = param_1;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }